

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O1

void __thiscall
FunctionTable::InsertTerm
          (FunctionTable *this,string *func_name,int space_length,int return_value_number,
          vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  pointer p_Var1;
  pointer p_Var2;
  pointer pcVar3;
  FunctionTableTerm term;
  string local_d8;
  FunctionTableTerm local_b8;
  
  p_Var1 = (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var2 = (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar3 = (func_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + func_name->_M_string_length);
  FunctionTableTerm::FunctionTableTerm
            (&local_b8,&local_d8,space_length,(int)((ulong)((long)p_Var1 - (long)p_Var2) >> 2),
             return_value_number,argument_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  std::vector<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>::push_back
            (&this->m_func_table,&local_b8);
  this->m_current_term_ptr = this->m_current_term_ptr + 1;
  if (local_b8.m_argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_argument_type.
                    super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_bottom_label._M_dataplus._M_p != &local_b8.m_bottom_label.field_2) {
    operator_delete(local_b8.m_bottom_label._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_top_label._M_dataplus._M_p != &local_b8.m_top_label.field_2) {
    operator_delete(local_b8.m_top_label._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_func_name._M_dataplus._M_p != &local_b8.m_func_name.field_2) {
    operator_delete(local_b8.m_func_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FunctionTable::InsertTerm(const string& func_name,
                               int space_length,
                               int return_value_number,
                               const vector<SymbolType>& argument_type) {
    int argument_number = argument_type.size();
    FunctionTableTerm term(func_name, space_length, argument_number, return_value_number, argument_type);
    m_func_table.push_back(term);
    m_current_term_ptr++;
}